

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void check_nms_dl_il_sl_tl_l2c(DisasContext_conflict6 *ctx)

{
  if (((((uint)ctx->CP0_Config5 >> 0x15 & 1) != 0) && ((ctx->CP0_Config1 & 0x80400) == 0)) &&
     ((ctx->CP0_Config5 & 0x400U) == 0 && (ctx->CP0_Config2 & 0x100010U) == 0)) {
    generate_exception_err(ctx,0x14,0);
    return;
  }
  return;
}

Assistant:

static inline void check_nms_dl_il_sl_tl_l2c(DisasContext *ctx)
{
    if (unlikely((ctx->CP0_Config5 & (1 << CP0C5_NMS)) &&
                 !(ctx->CP0_Config1 & (1 << CP0C1_DL)) &&
                 !(ctx->CP0_Config1 & (1 << CP0C1_IL)) &&
                 !(ctx->CP0_Config2 & (1 << CP0C2_SL)) &&
                 !(ctx->CP0_Config2 & (1 << CP0C2_TL)) &&
                 !(ctx->CP0_Config5 & (1 << CP0C5_L2C)))) {
        generate_exception_end(ctx, EXCP_RI);
    }
}